

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initializer.cpp
# Opt level: O1

void __thiscall
Am_Initializer::Am_Initializer
          (Am_Initializer *this,char *this_name,Am_Initializer_Procedure *init_proc,
          float this_priority,uint aCheckPoint,Am_Initializer_Procedure *cleanup_proc)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _Node_alloc_type *__alloc;
  _Node_alloc_type *__alloc_1;
  
  this->name = this_name;
  this->priority = this_priority;
  this->mCheckPoint = aCheckPoint;
  this->init = init_proc;
  this->cleanup = cleanup_proc;
  p_Var2 = (_List_node_base *)am_initializer_list_abi_cxx11_;
  p_Var1 = (_List_node_base *)am_initializer_list_abi_cxx11_;
  if (am_initializer_list_abi_cxx11_ == (INITIALIZERLIST *)0x0) {
    p_Var2 = (_List_node_base *)operator_new(0x18);
    (((_List_base<Am_Initializer_*,_std::allocator<Am_Initializer_*>_> *)&p_Var2->_M_next)->_M_impl)
    ._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    p_Var2->_M_prev = (_List_node_base *)0x0;
    p_Var2[1]._M_next = (_List_node_base *)0x0;
    p_Var2->_M_prev = p_Var2;
    p_Var2->_M_next = p_Var2;
    am_initializer_list_abi_cxx11_ = (INITIALIZERLIST *)p_Var2;
    p_Var1 = (_List_node_base *)operator_new(0x18);
    p_Var1[1]._M_next = (_List_node_base *)this;
    std::__detail::_List_node_base::_M_hook(p_Var1);
  }
  else {
    do {
      p_Var1 = (((INITIALIZERLIST *)p_Var1)->
               super__List_base<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>)._M_impl.
               _M_node.super__List_node_base._M_next;
      if (p_Var1 == (_List_node_base *)am_initializer_list_abi_cxx11_) {
        p_Var1 = (_List_node_base *)operator_new(0x18);
        p_Var1[1]._M_next = (_List_node_base *)this;
        goto LAB_0022968a;
      }
    } while (*(float *)((long)p_Var1[1]._M_next + 8) < this_priority);
    p_Var1 = (_List_node_base *)operator_new(0x18);
    p_Var1[1]._M_next = (_List_node_base *)this;
LAB_0022968a:
    std::__detail::_List_node_base::_M_hook(p_Var1);
  }
  p_Var2[1]._M_next = (_List_node_base *)((long)&(p_Var2[1]._M_next)->_M_next + 1);
  return;
}

Assistant:

Am_Initializer::Am_Initializer(const char *this_name,
                               Am_Initializer_Procedure *init_proc,
                               float this_priority, unsigned aCheckPoint,
                               Am_Initializer_Procedure *cleanup_proc)
    : cleanup(cleanup_proc), init(init_proc), name(this_name),
      priority(this_priority), mCheckPoint(aCheckPoint)
{
  // if this list is empty, we just add the element
  if (am_initializer_list == static_cast<INITIALIZERLIST *>(nullptr)) {
    am_initializer_list = new INITIALIZERLIST();
    am_initializer_list->push_front(this);
  } else {
    bool inserted(false);

    for (INITIALIZERLIST::iterator it = am_initializer_list->begin();
         it != am_initializer_list->end(); ++it) {
      // check to see if we have reached the point
      // where the object is inserted before
      if ((*it)->priority >= this_priority) {
        // insert the object and flag this
        am_initializer_list->insert(it, this);
        inserted = true;

        // exit the loop
        break;
      }
    }

    if (inserted == false) {
      // add to the end of the list
      am_initializer_list->push_back(this);
    }
  }
}